

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.c
# Opt level: O1

int rt_input_size(rt_context_pointer context,size_t index)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  lVar3 = (long)*(int *)(*(long *)((long)context + 0x38) + index * 4) * 0x20;
  lVar2 = (long)*(int *)(*(long *)((long)context + 0x18) + lVar3);
  if (0 < lVar2) {
    iVar1 = 1;
    lVar4 = 0;
    do {
      iVar1 = iVar1 * *(int *)(*(long *)(*(long *)((long)context + 0x18) + 8 + lVar3) + lVar4 * 4);
      lVar4 = lVar4 + 1;
    } while (lVar2 != lVar4);
    return iVar1;
  }
  return 1;
}

Assistant:

int rt_input_size(rt_context_pointer context, size_t index) {
  int i; // Iterator

  rt_context_t *c = context;
  rt_variable_t v = c->variables[c->input_variable_ids[index]];

  int size = 1;
  for (i = 0; i < v.shape.size; i++) {
    size *= v.shape.data[i];
  }

  return size;
}